

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O1

QJsonValue * __thiscall
QJsonObject::valueImpl<QLatin1String>
          (QJsonValue *__return_storage_ptr__,QJsonObject *this,QLatin1String key)

{
  qsizetype qVar1;
  QJsonValue *result;
  long in_FS_OFFSET;
  bool keyExists;
  bool local_39;
  QCborValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->o).d.ptr != (QCborContainerPrivate *)0x0) {
    local_39 = true;
    qVar1 = indexOf<QLatin1String>(&this->o,key,&local_39);
    if (local_39 != false) {
      QCborContainerPrivate::valueAt(&local_38,(this->o).d.ptr,qVar1 + 1);
      *(undefined1 **)&(__return_storage_ptr__->value).t = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QJsonValue::QJsonValue(__return_storage_ptr__,Null);
      QCborValue::operator=((QCborValue *)__return_storage_ptr__,&local_38);
      QCborValue::~QCborValue((QCborValue *)&local_38);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
      goto LAB_002f7609;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QJsonValue::QJsonValue(__return_storage_ptr__,Undefined);
    return __return_storage_ptr__;
  }
LAB_002f7609:
  __stack_chk_fail();
}

Assistant:

QJsonValue QJsonObject::valueImpl(T key) const
{
    if (!o)
        return QJsonValue(QJsonValue::Undefined);

    bool keyExists;
    auto i = indexOf(o, key, &keyExists);
    if (!keyExists)
        return QJsonValue(QJsonValue::Undefined);
    return QJsonPrivate::Value::fromTrustedCbor(o->valueAt(i + 1));
}